

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O3

void __thiscall
anurbs::RTree<3L>::sort
          (RTree<3L> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,Index left,
          Index right)

{
  ulong uVar1;
  pointer puVar2;
  long lVar3;
  long i;
  long lVar4;
  long right_00;
  
  if (left < right) {
    do {
      puVar2 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = *(ulong *)((long)puVar2 + (right + left & 0xfffffffffffffffeU) * 4);
      lVar3 = left + -1;
      right_00 = right + 1;
      while( true ) {
        do {
          i = lVar3 + 1;
          lVar4 = lVar3 + 1;
          lVar3 = i;
        } while (puVar2[lVar4] < uVar1);
        do {
          lVar4 = right_00;
          right_00 = lVar4 + -1;
        } while (uVar1 < puVar2[lVar4 + -1]);
        if (right_00 <= i) break;
        swap(this,values,i,right_00);
        puVar2 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      }
      sort(this,values,left,right_00);
      left = lVar4;
    } while (lVar4 < right);
  }
  return;
}

Assistant:

void sort(std::vector<size_t>& values, const Index left, const Index right)
    {
        if (left >= right) {
            return;
        }

        const size_t pivot = values[(left + right) >> 1];

        Index i = left - 1;
        Index j = right + 1;

        while (true) {
            do {
                i += 1;
            } while(values[i] < pivot);

            do {
                j -= 1;
            } while(values[j] > pivot);

            if (i >= j) {
                break;
            }

            swap(values, i, j);
        }

        sort(values, left, j);
        sort(values, j + 1, right);
    }